

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

CRCImpl * absl::lts_20250127::crc_internal::CRCImpl::NewInternal(void)

{
  CRC32 *local_10;
  CRCImpl *result;
  
  local_10 = (CRC32 *)TryNewCRC32AcceleratedX86ARMCombined();
  if (local_10 == (CRC32 *)0x0) {
    local_10 = (CRC32 *)operator_new(0x2008);
    memset(local_10,0,0x2008);
    CRC32::CRC32(local_10);
  }
  (*(local_10->super_CRCImpl).super_CRC._vptr_CRC[7])();
  return &local_10->super_CRCImpl;
}

Assistant:

CRCImpl* CRCImpl::NewInternal() {
  // Find an accelearated implementation first.
  CRCImpl* result = TryNewCRC32AcceleratedX86ARMCombined();

  // Fall back to generic implementions if no acceleration is available.
  if (result == nullptr) {
    result = new CRC32();
  }

  result->InitTables();

  return result;
}